

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbitmap.c
# Opt level: O0

FT_Error FT_Bitmap_Blend(FT_Library library,FT_Bitmap *source_,FT_Vector source_offset_,
                        FT_Bitmap *target,FT_Vector *atarget_offset,FT_Color color)

{
  byte *pbVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  FT_Pointer pvVar13;
  uchar *puVar14;
  uchar *puVar15;
  ulong local_1c0;
  long local_1b8;
  long local_1b0;
  ulong local_1a8;
  int ba;
  int br;
  int bg;
  int bb;
  int ba2;
  int fr;
  int fg;
  int fb;
  int fa;
  int aa;
  uchar *limit_r;
  uchar *s;
  uchar *r;
  uchar *limit_p_1;
  uchar *q_1;
  uchar *p_1;
  uchar *limit_p;
  uchar *q;
  uchar *p;
  uchar *buffer;
  int new_pitch;
  int pitch;
  long y;
  long x;
  uint final_width;
  uint final_rows;
  FT_Pos final_ury;
  FT_Pos final_urx;
  FT_Pos final_lly;
  FT_Pos final_llx;
  FT_Pos target_ury;
  FT_Pos target_urx;
  FT_Pos target_lly;
  FT_Pos target_llx;
  FT_Pos source_ury;
  FT_Pos source_urx;
  FT_Pos source_lly;
  FT_Pos source_llx;
  FT_Bool free_target_bitmap_on_error;
  FT_Bool free_source_bitmap;
  FT_Vector target_offset;
  FT_Vector source_offset;
  FT_Bitmap *source;
  FT_Bitmap source_bitmap;
  FT_Memory memory;
  FT_Vector *pFStack_40;
  FT_Error error;
  FT_Vector *atarget_offset_local;
  FT_Bitmap *target_local;
  FT_Bitmap *source__local;
  FT_Library library_local;
  FT_Vector source_offset__local;
  
  source_offset__local.x = source_offset_.y;
  library_local = (FT_Library)source_offset_.x;
  memory._4_4_ = 0;
  bVar5 = false;
  bVar4 = false;
  if ((((library == (FT_Library)0x0) || (target == (FT_Bitmap *)0x0)) ||
      (source_ == (FT_Bitmap *)0x0)) || (atarget_offset == (FT_Vector *)0x0)) {
    return 6;
  }
  source_bitmap.palette = library->memory;
  if ((target->pixel_mode != '\0') &&
     ((target->pixel_mode != '\a' || (target->buffer == (uchar *)0x0)))) {
    return 6;
  }
  if (source_->pixel_mode == '\0') {
    return 0;
  }
  if ((target->pixel_mode == '\a') && ((source_->pitch ^ target->pitch) < 0)) {
    return 6;
  }
  if ((source_->width == 0) || (source_->rows == 0)) {
    return 0;
  }
  uVar10 = (ulong)library_local & 0xffffffffffffffc0;
  local_1c0 = source_offset__local.x & 0xffffffffffffffc0;
  target_lly = atarget_offset->x & 0xffffffffffffffc0;
  final_llx = atarget_offset->y & 0xffffffffffffffc0;
  if ((long)local_1c0 < (long)((ulong)(source_->rows << 6) + 0x8000000000000040)) {
    return 6;
  }
  lVar11 = local_1c0 - (source_->rows << 6);
  if ((long)(0x7fffffffffffffbf - (ulong)(source_->width << 6)) < (long)uVar10) {
    return 6;
  }
  local_1b8 = uVar10 + (source_->width << 6);
  if ((target->width == 0) || (target->rows == 0)) {
    target_lly = 0x7fffffffffffffff;
    target_urx = 0x7fffffffffffffff;
    target_ury = -0x8000000000000000;
    final_llx = -0x8000000000000000;
  }
  else {
    if (final_llx < (long)((ulong)(target->rows << 6) + 0x8000000000000000)) {
      return 6;
    }
    target_urx = final_llx - (ulong)(target->rows << 6);
    if ((long)(0x7fffffffffffffff - (ulong)(target->width << 6)) < target_lly) {
      return 6;
    }
    target_ury = target_lly + (ulong)(target->width << 6);
  }
  local_1a8 = uVar10;
  if (target_lly <= (long)uVar10) {
    local_1a8 = target_lly;
  }
  local_1b0 = lVar11;
  if (target_urx <= lVar11) {
    local_1b0 = target_urx;
  }
  if (local_1b8 <= target_ury) {
    local_1b8 = target_ury;
  }
  if ((long)local_1c0 <= final_llx) {
    local_1c0 = final_llx;
  }
  uVar6 = (uint)((long)(local_1b8 - local_1a8) >> 6);
  uVar12 = (long)(local_1c0 - local_1b0) >> 6;
  uVar7 = (uint)uVar12;
  if ((uVar6 == 0) || (uVar7 == 0)) {
    return 0;
  }
  if ((target->width != 0) && (target->rows != 0)) {
    target_lly = target_lly - local_1a8;
    target_urx = target_urx - local_1b0;
  }
  pFStack_40 = atarget_offset;
  atarget_offset_local = (FT_Vector *)target;
  target_local = source_;
  source__local = (FT_Bitmap *)library;
  if (target->pixel_mode == '\0') {
    target->width = uVar6;
    target->rows = uVar7;
    target->pixel_mode = '\a';
    target->pitch = uVar6 << 2;
    target->num_grays = 0x100;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8);
    if (SUB168((auVar2 << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)target->pitch),0) <
        (long)(int)target->rows) {
      return 6;
    }
    pvVar13 = ft_mem_alloc((FT_Memory)source_bitmap.palette,
                           (long)(int)(target->pitch * target->rows),(FT_Error *)((long)&memory + 4)
                          );
    atarget_offset_local[1].x = (FT_Pos)pvVar13;
    if (memory._4_4_ != 0) {
      return memory._4_4_;
    }
    bVar4 = true;
  }
  else if ((target->width != uVar6) || (target->rows != uVar7)) {
    buffer._4_4_ = target->pitch;
    if (buffer._4_4_ < 0) {
      buffer._4_4_ = -buffer._4_4_;
    }
    iVar9 = uVar6 * 4;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8);
    if (SUB168((auVar3 << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)iVar9),0) <
        (long)(int)uVar7) {
      return 6;
    }
    pvVar13 = ft_mem_alloc((FT_Memory)source_bitmap.palette,(long)(int)(iVar9 * uVar7),
                           (FT_Error *)((long)&memory + 4));
    if (memory._4_4_ != 0) goto LAB_00378b4b;
    if (-1 < (int)atarget_offset_local->y) {
      q = (uchar *)atarget_offset_local[1].x;
      limit_p = (uchar *)((long)pvVar13 +
                         (target_lly >> 6) * 4 +
                         (((uVar12 & 0xffffffff) - (target_urx >> 6)) -
                         (ulong)(uint)atarget_offset_local->x) * (long)iVar9);
      puVar14 = q + buffer._4_4_ * (int)atarget_offset_local->x;
      for (; q < puVar14; q = q + buffer._4_4_) {
        memcpy(limit_p,q,(long)buffer._4_4_);
        limit_p = limit_p + iVar9;
      }
    }
    ft_mem_free((FT_Memory)source_bitmap.palette,(void *)atarget_offset_local[1].x);
    atarget_offset_local[1].x = 0;
    *(uint *)((long)&atarget_offset_local->x + 4) = uVar6;
    *(uint *)&atarget_offset_local->x = uVar7;
    if ((int)atarget_offset_local->y < 0) {
      *(uint *)&atarget_offset_local->y = uVar6 * -4;
    }
    else {
      *(int *)&atarget_offset_local->y = iVar9;
    }
    atarget_offset_local[1].x = (FT_Pos)pvVar13;
  }
  if (target_local->pixel_mode == '\x02') {
    source_offset.y = (FT_Pos)target_local;
  }
  else {
    FT_Bitmap_Init((FT_Bitmap *)&source);
    memory._4_4_ = FT_Bitmap_Convert((FT_Library)source__local,target_local,(FT_Bitmap *)&source,1);
    if (memory._4_4_ != 0) goto LAB_00378b4b;
    source_offset.y = (FT_Pos)&source;
    bVar5 = true;
  }
  if (-1 < (int)atarget_offset_local->y) {
    q_1 = *(uchar **)(source_offset.y + 0x10);
    limit_p_1 = (uchar *)(atarget_offset_local[1].x +
                          (((ulong)(uint)atarget_offset_local->x - (lVar11 - local_1b0 >> 6)) -
                          (ulong)*(uint *)source_offset.y) * (long)(int)atarget_offset_local->y +
                         ((long)(uVar10 - local_1a8) >> 6) * 4);
    puVar14 = q_1 + *(int *)(source_offset.y + 8) * *(int *)source_offset.y;
    for (; q_1 < puVar14; q_1 = q_1 + *(int *)(source_offset.y + 8)) {
      s = q_1;
      limit_r = limit_p_1;
      uVar6 = *(uint *)(source_offset.y + 4);
      while (s < q_1 + uVar6) {
        uVar8 = (((uint)color >> 0x18) * (uint)*s) / 0xff;
        iVar9 = 0xff - uVar8;
        pbVar1 = limit_r + 3;
        *limit_r = (char)((int)((uint)*limit_r * iVar9) / 0xff) +
                   (char)((((uint)color & 0xff) * uVar8) / 0xff);
        limit_r[1] = (char)((int)((uint)limit_r[1] * iVar9) / 0xff) +
                     (char)((((uint)color >> 8 & 0xff) * uVar8) / 0xff);
        puVar15 = limit_r + 3;
        limit_r[2] = (char)((int)((uint)limit_r[2] * iVar9) / 0xff) +
                     (char)((((uint)color >> 0x10 & 0xff) * uVar8) / 0xff);
        limit_r = limit_r + 4;
        *puVar15 = (char)((int)((uint)*pbVar1 * iVar9) / 0xff) + (char)uVar8;
        s = s + 1;
      }
      limit_p_1 = limit_p_1 + (int)atarget_offset_local->y;
    }
  }
  pFStack_40->x = local_1a8;
  pFStack_40->y = local_1b0 + (ulong)(uVar7 << 6);
LAB_00378b4b:
  if ((memory._4_4_ != 0) && (bVar4)) {
    FT_Bitmap_Done((FT_Library)source__local,(FT_Bitmap *)atarget_offset_local);
  }
  if (bVar5) {
    FT_Bitmap_Done((FT_Library)source__local,(FT_Bitmap *)&source);
  }
  return memory._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Bitmap_Blend( FT_Library        library,
                   const FT_Bitmap*  source_,
                   const FT_Vector   source_offset_,
                   FT_Bitmap*        target,
                   FT_Vector        *atarget_offset,
                   FT_Color          color )
  {
    FT_Error   error = FT_Err_Ok;
    FT_Memory  memory;

    FT_Bitmap         source_bitmap;
    const FT_Bitmap*  source;

    FT_Vector  source_offset;
    FT_Vector  target_offset;

    FT_Bool  free_source_bitmap          = 0;
    FT_Bool  free_target_bitmap_on_error = 0;

    FT_Pos  source_llx, source_lly, source_urx, source_ury;
    FT_Pos  target_llx, target_lly, target_urx, target_ury;
    FT_Pos  final_llx, final_lly, final_urx, final_ury;

    unsigned int  final_rows, final_width;
    long          x, y;


    if ( !library || !target || !source_ || !atarget_offset )
      return FT_THROW( Invalid_Argument );

    memory = library->memory;

    if ( !( target->pixel_mode == FT_PIXEL_MODE_NONE     ||
            ( target->pixel_mode == FT_PIXEL_MODE_BGRA &&
              target->buffer                           ) ) )
      return FT_THROW( Invalid_Argument );

    if ( source_->pixel_mode == FT_PIXEL_MODE_NONE )
      return FT_Err_Ok;               /* nothing to do */

    /* pitches must have the same sign */
    if ( target->pixel_mode == FT_PIXEL_MODE_BGRA &&
         ( source_->pitch ^ target->pitch ) < 0   )
      return FT_THROW( Invalid_Argument );

    if ( !( source_->width && source_->rows ) )
      return FT_Err_Ok;               /* nothing to do */

    /* assure integer pixel offsets */
    source_offset.x = FT_PIX_FLOOR( source_offset_.x );
    source_offset.y = FT_PIX_FLOOR( source_offset_.y );
    target_offset.x = FT_PIX_FLOOR( atarget_offset->x );
    target_offset.y = FT_PIX_FLOOR( atarget_offset->y );

    /* get source bitmap dimensions */
    source_llx = source_offset.x;
    if ( FT_LONG_MIN + (FT_Pos)( source_->rows << 6 ) + 64 > source_offset.y )
    {
      FT_TRACE5((
        "FT_Bitmap_Blend: y coordinate overflow in source bitmap\n" ));
      return FT_THROW( Invalid_Argument );
    }
    source_lly = source_offset.y - ( source_->rows << 6 );

    if ( FT_LONG_MAX - (FT_Pos)( source_->width << 6 ) - 64 < source_llx )
    {
      FT_TRACE5((
        "FT_Bitmap_Blend: x coordinate overflow in source bitmap\n" ));
      return FT_THROW( Invalid_Argument );
    }
    source_urx = source_llx + ( source_->width << 6 );
    source_ury = source_offset.y;

    /* get target bitmap dimensions */
    if ( target->width && target->rows )
    {
      target_llx = target_offset.x;
      if ( FT_LONG_MIN + (FT_Pos)( target->rows << 6 ) > target_offset.y )
      {
        FT_TRACE5((
          "FT_Bitmap_Blend: y coordinate overflow in target bitmap\n" ));
        return FT_THROW( Invalid_Argument );
      }
      target_lly = target_offset.y - ( target->rows << 6 );

      if ( FT_LONG_MAX - (FT_Pos)( target->width << 6 ) < target_llx )
      {
        FT_TRACE5((
          "FT_Bitmap_Blend: x coordinate overflow in target bitmap\n" ));
        return FT_THROW( Invalid_Argument );
      }
      target_urx = target_llx + ( target->width << 6 );
      target_ury = target_offset.y;
    }
    else
    {
      target_llx = FT_LONG_MAX;
      target_lly = FT_LONG_MAX;
      target_urx = FT_LONG_MIN;
      target_ury = FT_LONG_MIN;
    }

    /* compute final bitmap dimensions */
    final_llx = FT_MIN( source_llx, target_llx );
    final_lly = FT_MIN( source_lly, target_lly );
    final_urx = FT_MAX( source_urx, target_urx );
    final_ury = FT_MAX( source_ury, target_ury );

    final_width = ( final_urx - final_llx ) >> 6;
    final_rows  = ( final_ury - final_lly ) >> 6;

#ifdef FT_DEBUG_LEVEL_TRACE
    FT_TRACE5(( "FT_Bitmap_Blend:\n" ));
    FT_TRACE5(( "  source bitmap: (%ld, %ld) -- (%ld, %ld); %d x %d\n",
      source_llx / 64, source_lly / 64,
      source_urx / 64, source_ury / 64,
      source_->width, source_->rows ));

    if ( target->width && target->rows )
      FT_TRACE5(( "  target bitmap: (%ld, %ld) -- (%ld, %ld); %d x %d\n",
        target_llx / 64, target_lly / 64,
        target_urx / 64, target_ury / 64,
        target->width, target->rows ));
    else
      FT_TRACE5(( "  target bitmap: empty\n" ));

    if ( final_width && final_rows )
      FT_TRACE5(( "  final bitmap: (%ld, %ld) -- (%ld, %ld); %d x %d\n",
        final_llx / 64, final_lly / 64,
        final_urx / 64, final_ury / 64,
        final_width, final_rows ));
    else
      FT_TRACE5(( "  final bitmap: empty\n" ));
#endif /* FT_DEBUG_LEVEL_TRACE */

    if ( !( final_width && final_rows ) )
      return FT_Err_Ok;               /* nothing to do */

    /* for blending, set offset vector of final bitmap */
    /* temporarily to (0,0)                            */
    source_llx -= final_llx;
    source_lly -= final_lly;

    if ( target->width && target->rows )
    {
      target_llx -= final_llx;
      target_lly -= final_lly;
    }

    /* set up target bitmap */
    if ( target->pixel_mode == FT_PIXEL_MODE_NONE )
    {
      /* create new empty bitmap */
      target->width      = final_width;
      target->rows       = final_rows;
      target->pixel_mode = FT_PIXEL_MODE_BGRA;
      target->pitch      = (int)final_width * 4;
      target->num_grays  = 256;

      if ( FT_LONG_MAX / target->pitch < (int)target->rows )
      {
        FT_TRACE5(( "FT_Blend_Bitmap: target bitmap too large (%d x %d)\n",
                     final_width, final_rows ));
        return FT_THROW( Invalid_Argument );
      }

      if ( FT_ALLOC( target->buffer, target->pitch * (int)target->rows ) )
        return error;

      free_target_bitmap_on_error = 1;
    }
    else if ( target->width != final_width ||
              target->rows  != final_rows  )
    {
      /* adjust old bitmap to enlarged size */
      int  pitch, new_pitch;

      unsigned char*  buffer = NULL;


      pitch = target->pitch;

      if ( pitch < 0 )
        pitch = -pitch;

      new_pitch = (int)final_width * 4;

      if ( FT_LONG_MAX / new_pitch < (int)final_rows )
      {
        FT_TRACE5(( "FT_Blend_Bitmap: target bitmap too large (%d x %d)\n",
                     final_width, final_rows ));
        return FT_THROW( Invalid_Argument );
      }

      /* TODO: provide an in-buffer solution for large bitmaps */
      /*       to avoid allocation of a new buffer             */
      if ( FT_ALLOC( buffer, new_pitch * (int)final_rows ) )
        goto Error;

      /* copy data to new buffer */
      x = target_llx >> 6;
      y = target_lly >> 6;

      /* the bitmap flow is from top to bottom, */
      /* but y is measured from bottom to top   */
      if ( target->pitch < 0 )
      {
        /* XXX */
      }
      else
      {
        unsigned char*  p =
          target->buffer;
        unsigned char*  q =
          buffer +
          ( final_rows - y - target->rows ) * new_pitch +
          x * 4;
        unsigned char*  limit_p =
          p + pitch * (int)target->rows;


        while ( p < limit_p )
        {
          FT_MEM_COPY( q, p, pitch );

          p += pitch;
          q += new_pitch;
        }
      }

      FT_FREE( target->buffer );

      target->width = final_width;
      target->rows  = final_rows;

      if ( target->pitch < 0 )
        target->pitch = -new_pitch;
      else
        target->pitch = new_pitch;

      target->buffer = buffer;
    }

    /* adjust source bitmap if necessary */
    if ( source_->pixel_mode != FT_PIXEL_MODE_GRAY )
    {
      FT_Bitmap_Init( &source_bitmap );
      error = FT_Bitmap_Convert( library, source_, &source_bitmap, 1 );
      if ( error )
        goto Error;

      source             = &source_bitmap;
      free_source_bitmap = 1;
    }
    else
      source = source_;

    /* do blending; the code below returns pre-multiplied channels, */
    /* similar to what FreeType gets from `CBDT' tables             */
    x = source_llx >> 6;
    y = source_lly >> 6;

    /* the bitmap flow is from top to bottom, */
    /* but y is measured from bottom to top   */
    if ( target->pitch < 0 )
    {
      /* XXX */
    }
    else
    {
      unsigned char*  p =
        source->buffer;
      unsigned char*  q =
        target->buffer +
        ( target->rows - y - source->rows ) * target->pitch +
        x * 4;
      unsigned char*  limit_p =
        p + source->pitch * (int)source->rows;


      while ( p < limit_p )
      {
        unsigned char*  r       = p;
        unsigned char*  s       = q;
        unsigned char*  limit_r = r + source->width;


        while ( r < limit_r )
        {
          int  aa = *r++;
          int  fa = color.alpha * aa / 255;

          int  fb = color.blue * fa / 255;
          int  fg = color.green * fa / 255;
          int  fr = color.red * fa / 255;

          int  ba2 = 255 - fa;

          int  bb = s[0];
          int  bg = s[1];
          int  br = s[2];
          int  ba = s[3];


          *s++ = (unsigned char)( bb * ba2 / 255 + fb );
          *s++ = (unsigned char)( bg * ba2 / 255 + fg );
          *s++ = (unsigned char)( br * ba2 / 255 + fr );
          *s++ = (unsigned char)( ba * ba2 / 255 + fa );
        }

        p += source->pitch;
        q += target->pitch;
      }
    }

    atarget_offset->x = final_llx;
    atarget_offset->y = final_lly + ( final_rows << 6 );

  Error:
    if ( error && free_target_bitmap_on_error )
      FT_Bitmap_Done( library, target );

    if ( free_source_bitmap )
      FT_Bitmap_Done( library, &source_bitmap );

    return error;
  }